

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int init_declarator_list(sym_t *s)

{
  int iVar1;
  sym_t *s_00;
  sym_t *in_RDI;
  sym_t *s2;
  sym_t *in_stack_ffffffffffffffe8;
  
  iVar1 = init_declarator(in_stack_ffffffffffffffe8);
  while( true ) {
    if (iVar1 == 0) {
      return 0;
    }
    if (t->id != 0x2c) break;
    s_00 = create_sym();
    strcpy(s_00->id,in_RDI->id);
    s_00->type_id = in_RDI->type_id;
    in_RDI->id[0] = '\0';
    syms_add(in_RDI);
    next();
    iVar1 = init_declarator(s_00);
  }
  return 1;
}

Assistant:

int init_declarator_list(sym_t* s)
{
    if (init_declarator(s))
    {
        while (t->id == ',')
        {
            sym_t* s2 = create_sym();
            strcpy(s2->id, s->id);
            s2->type_id = s->type_id;
            s->id[0] = 0;
            syms_add(s2);

            next();

            if (!init_declarator(s))
                return 0;   /* ?????????????? */
        }
        return 1;
    }

    return 0;
}